

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumNoInline
               (CodedInputStream *input,_func_bool_int *is_valid,RepeatedField<int> *values)

{
  bool bVar1;
  Limit limit;
  int iVar2;
  int value;
  uint32 length;
  int local_30;
  uint32 local_2c;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_2c);
  if (bVar1) {
    limit = io::CodedInputStream::PushLimit(input,local_2c);
LAB_005b3d70:
    iVar2 = io::CodedInputStream::BytesUntilLimit(input);
    if (0 < iVar2) {
      bVar1 = ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (input,&local_30);
      if (bVar1) {
        if (is_valid != (_func_bool_int *)0x0) goto code_r0x005b3d90;
        goto LAB_005b3d9b;
      }
      goto LAB_005b3da8;
    }
    io::CodedInputStream::PopLimit(input,limit);
    bVar1 = true;
  }
  else {
LAB_005b3da8:
    bVar1 = false;
  }
  return bVar1;
code_r0x005b3d90:
  bVar1 = (*is_valid)(local_30);
  if (bVar1) {
LAB_005b3d9b:
    RepeatedField<int>::Add(values,&local_30);
  }
  goto LAB_005b3d70;
}

Assistant:

bool WireFormatLite::ReadPackedEnumNoInline(io::CodedInputStream* input,
                                            bool (*is_valid)(int),
                                            RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!google::protobuf::internal::WireFormatLite::ReadPrimitive<
        int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    }
  }
  input->PopLimit(limit);
  return true;
}